

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O1

void mapAddIsland(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  ulong local_50;
  int *local_38;
  
  (*l->p->getMap)(l->p,out,(long)((int)areaX + -1),(long)((int)areaZ + -1),areaWidth + 2U,
                  areaHeight + 2);
  if (0 < areaHeight) {
    lVar4 = l->worldSeed;
    lVar9 = (lVar4 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar4;
    uVar10 = (ulong)(areaWidth + 2U);
    piVar15 = out + uVar10 * 2 + 2;
    lVar1 = areaX + lVar9;
    piVar5 = out + uVar10 + 1;
    local_50 = 0;
    local_38 = out;
    do {
      if (0 < areaWidth) {
        lVar6 = areaZ + local_50;
        uVar13 = 0;
        lVar12 = areaX * 0x5851f42d4c957f2d + 0x14057b7ef767814f + lVar9 * 0x5851f42d4c957f2d;
        do {
          iVar16 = out[uVar13];
          iVar17 = out[uVar13 + 2];
          iVar2 = piVar15[uVar13 - 2];
          iVar3 = piVar15[uVar13];
          iVar14 = piVar5[uVar13];
          if ((iVar14 == 0) && ((((iVar16 != 0 || (iVar17 != 0)) || (iVar2 != 0)) || (iVar3 != 0))))
          {
            lVar11 = (lVar1 + uVar13) * lVar12 + lVar6;
            lVar11 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + areaX + uVar13;
            uVar7 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar6;
            if (iVar16 == 0) {
              iVar14 = 1;
            }
            else {
              uVar7 = (uVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar7 + lVar4;
              iVar14 = iVar16;
            }
            cVar8 = iVar16 != 0;
            if (iVar17 != 0) {
              cVar8 = cVar8 + '\x01';
              if ((uVar7 & 0x1000000) == 0) {
                iVar14 = iVar17;
              }
              if (iVar16 == 0) {
                iVar14 = iVar17;
              }
              uVar7 = (uVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar7 + lVar4;
            }
            iVar16 = iVar14;
            if (iVar2 != 0) {
              iVar16 = iVar2;
              if (cVar8 != '\0') {
                if (cVar8 == '\x01') {
                  if (((uint)uVar7 >> 0x18 & 1) != 0) {
                    iVar16 = iVar14;
                  }
                }
                else if (0x5555555555555554 <
                         ((long)uVar7 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU) {
                  iVar16 = iVar14;
                }
              }
              cVar8 = cVar8 + '\x01';
              uVar7 = (uVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar7 + lVar4;
            }
            iVar17 = iVar16;
            if (iVar3 != 0) {
              iVar17 = iVar3;
              if (cVar8 != '\0') {
                if (cVar8 == '\x02') {
                  if (0x5555555555555554 <
                      ((long)uVar7 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU) {
                    iVar17 = iVar16;
                  }
                }
                else if (cVar8 == '\x01') {
                  if (((uint)uVar7 >> 0x18 & 1) != 0) {
                    iVar17 = iVar16;
                  }
                }
                else if ((uVar7 & 0x3000000) != 0) {
                  iVar17 = iVar16;
                }
              }
              uVar7 = (uVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar7 + lVar4;
            }
            if (((long)uVar7 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU <
                0x5555555555555555) {
              local_38[uVar13] = iVar17;
            }
            else if (iVar17 == 4) {
              local_38[uVar13] = 4;
            }
            else {
              local_38[uVar13] = 0;
            }
          }
          else if ((iVar14 < 1) ||
                  (((iVar16 != 0 && (iVar17 != 0)) && ((iVar2 != 0 && (iVar3 != 0)))))) {
            local_38[uVar13] = iVar14;
          }
          else {
            lVar11 = (lVar1 + uVar13) * lVar12 + lVar6;
            lVar11 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + areaX + uVar13;
            if (((lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar6 >> 0x18) *
                -0x3333333333333333 + 0x1999999999999999U < 0x3333333333333333) {
              local_38[uVar13] = (uint)(iVar14 == 4) << 2;
            }
            else {
              local_38[uVar13] = iVar14;
            }
          }
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x5851f42d4c957f2d;
        } while ((uint)areaWidth != uVar13);
      }
      local_50 = local_50 + 1;
      local_38 = local_38 + (uint)areaWidth;
      piVar15 = piVar15 + uVar10;
      out = out + uVar10;
      piVar5 = piVar5 + uVar10;
    } while (local_50 != (uint)areaHeight);
  }
  return;
}

Assistant:

void mapAddIsland(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    int pX = (int)areaX - 1;
    int pZ = (int)areaZ - 1;
    int pWidth = areaWidth + 2;
    int pHeight = areaHeight + 2;
    int x, z;

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    const int64_t ws = l->worldSeed;
    const int64_t ss = ws * (ws * 6364136223846793005LL + 1442695040888963407LL);

    for (z = 0; z < areaHeight; z++) {
        for (x = 0; x < areaWidth; x++) {
            int v00 = out[x + 0 + (z + 0) * pWidth];
            int v20 = out[x + 2 + (z + 0) * pWidth];
            int v02 = out[x + 0 + (z + 2) * pWidth];
            int v22 = out[x + 2 + (z + 2) * pWidth];
            int v11 = out[x + 1 + (z + 1) * pWidth];

            if (v11 == 0 && (v00 != 0 || v20 != 0 || v02 != 0 || v22 != 0)) {
                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);
                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                int v = 1;
                int inc = 0;

                if (v00 != 0) {
                    ++inc;
                    v = v00;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v20 != 0) {
                    if (++inc == 1 || (cs & (1LL << 24)) == 0) v = v20;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v02 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v02;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v02;
                            break;
                        default:
                            if (((cs >> 24) % 3) == 0) v = v02;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v22 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v22;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v22;
                            break;
                        case 3:
                            if (((cs >> 24) % 3) == 0) v = v22;
                            break;
                        default:
                            if ((cs & (3LL << 24)) == 0) v = v22;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }

                if ((cs >> 24) % 3 == 0)
                    out[x + z * areaWidth] = v;
                else if (v == 4)
                    out[x + z * areaWidth] = 4;
                else
                    out[x + z * areaWidth] = 0;
            } else if (v11 > 0 && (v00 == 0 || v20 == 0 || v02 == 0 || v22 == 0)) {
                //setChunkSeed(l, (int64_t)(x + areaX), (int64_t)(z + areaZ));
                //if (mcNextInt(l, 5) == 0)...

                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);

                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                if ((cs >> 24) % 5 == 0)
                    out[x + z * areaWidth] = (v11 == 4) ? 4 : 0;
                else
                    out[x + z * areaWidth] = v11;
            } else {
                out[x + z * areaWidth] = v11;
            }
        }
    }
}